

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationDataBuilder::buildMappings
          (CollationDataBuilder *this,CollationData *data,UErrorCode *errorCode)

{
  UTrie2 *trie;
  bool bVar1;
  UBool UVar2;
  uint32_t uVar3;
  int32_t iVar4;
  uint32_t *puVar5;
  int64_t *piVar6;
  char16_t *pcVar7;
  ushort local_16e;
  int local_16c;
  UChar lead;
  UChar32 c;
  UChar32 limit_1;
  uint32_t ce32_1;
  UChar32 c_2;
  UChar32 limit;
  uint32_t ce32;
  int32_t i_2;
  UChar32 c_1;
  uint32_t hangulCE32;
  int32_t i_1;
  int32_t iStack_13c;
  UBool isAnyJamoVTSpecial;
  int32_t i;
  int32_t jamoIndex;
  uint32_t jamoCE32s [67];
  UErrorCode *errorCode_local;
  CollationData *data_local;
  CollationDataBuilder *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    if ((this->trie == (UTrie2 *)0x0) || (UVar2 = utrie2_isFrozen_63(this->trie), UVar2 != '\0')) {
      *errorCode = U_INVALID_STATE_ERROR;
    }
    else {
      buildContexts(this,errorCode);
      iStack_13c = -1;
      UVar2 = getJamoCE32s(this,(uint32_t *)&i,errorCode);
      if (UVar2 == '\0') {
        limit_1 = 0xac00;
        while (limit_1 < 0xd7a4) {
          uVar3 = CollationData::getCE32(this->base,limit_1);
          utrie2_setRange32_63(this->trie,limit_1,limit_1 + 0x24b,uVar3,'\x01',errorCode);
          limit_1 = limit_1 + 0x24c;
        }
      }
      else {
        iStack_13c = UVector32::size(&this->ce32s);
        for (i_1 = 0; i_1 < 0x43; i_1 = i_1 + 1) {
          UVector32::addElement(&this->ce32s,(&i)[i_1],errorCode);
        }
        bVar1 = false;
        for (c_1 = 0x13; c_1 < 0x43; c_1 = c_1 + 1) {
          UVar2 = Collation::isSpecialCE32((&i)[c_1]);
          if (UVar2 != '\0') {
            bVar1 = true;
            break;
          }
        }
        uVar3 = Collation::makeCE32FromTagAndIndex(0xc,0);
        ce32 = 0xac00;
        for (limit = 0; limit < 0x13; limit = limit + 1) {
          c_2 = uVar3;
          if ((!bVar1) && (UVar2 = Collation::isSpecialCE32((&i)[limit]), UVar2 == '\0')) {
            c_2 = uVar3 | 0x100;
          }
          utrie2_setRange32_63(this->trie,ce32,ce32 + 0x24b,c_2,'\x01',errorCode);
          ce32 = ce32 + 0x24c;
        }
      }
      setDigitTags(this,errorCode);
      setLeadSurrogates(this,errorCode);
      uVar3 = utrie2_get32_63(this->trie,0);
      UVector32::setElementAt(&this->ce32s,uVar3,0);
      trie = this->trie;
      uVar3 = Collation::makeCE32FromTagAndIndex(0xb,0);
      utrie2_set32_63(trie,0,uVar3,errorCode);
      utrie2_freeze_63(this->trie,UTRIE2_32_VALUE_BITS,errorCode);
      UVar2 = ::U_FAILURE(*errorCode);
      if (UVar2 == '\0') {
        local_16c = 0x10000;
        for (local_16e = 0xd800; local_16e < 0xdc00; local_16e = local_16e + 1) {
          UVar2 = UnicodeSet::containsSome(&this->unsafeBackwardSet,local_16c,local_16c + 0x3ff);
          if (UVar2 != '\0') {
            UnicodeSet::add(&this->unsafeBackwardSet,(uint)local_16e);
          }
          local_16c = local_16c + 0x400;
        }
        UnicodeSet::freeze(&this->unsafeBackwardSet);
        data->trie = this->trie;
        puVar5 = (uint32_t *)UVector32::getBuffer(&this->ce32s);
        data->ce32s = puVar5;
        piVar6 = UVector64::getBuffer(&this->ce64s);
        data->ces = piVar6;
        pcVar7 = icu_63::UnicodeString::getBuffer(&this->contexts);
        data->contexts = pcVar7;
        iVar4 = UVector32::size(&this->ce32s);
        data->ce32sLength = iVar4;
        iVar4 = UVector64::size(&this->ce64s);
        data->cesLength = iVar4;
        iVar4 = icu_63::UnicodeString::length(&this->contexts);
        data->contextsLength = iVar4;
        data->base = this->base;
        if (iStack_13c < 0) {
          data->jamoCE32s = this->base->jamoCE32s;
        }
        else {
          data->jamoCE32s = data->ce32s + iStack_13c;
        }
        data->unsafeBackwardSet = &this->unsafeBackwardSet;
      }
    }
  }
  return;
}

Assistant:

void
CollationDataBuilder::buildMappings(CollationData &data, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    if(trie == NULL || utrie2_isFrozen(trie)) {
        errorCode = U_INVALID_STATE_ERROR;
        return;
    }

    buildContexts(errorCode);

    uint32_t jamoCE32s[CollationData::JAMO_CE32S_LENGTH];
    int32_t jamoIndex = -1;
    if(getJamoCE32s(jamoCE32s, errorCode)) {
        jamoIndex = ce32s.size();
        for(int32_t i = 0; i < CollationData::JAMO_CE32S_LENGTH; ++i) {
            ce32s.addElement((int32_t)jamoCE32s[i], errorCode);
        }
        // Small optimization: Use a bit in the Hangul ce32
        // to indicate that none of the Jamo CE32s are isSpecialCE32()
        // (as it should be in the root collator).
        // It allows CollationIterator to avoid recursive function calls and per-Jamo tests.
        // In order to still have good trie compression and keep this code simple,
        // we only set this flag if a whole block of 588 Hangul syllables starting with
        // a common leading consonant (Jamo L) has this property.
        UBool isAnyJamoVTSpecial = FALSE;
        for(int32_t i = Hangul::JAMO_L_COUNT; i < CollationData::JAMO_CE32S_LENGTH; ++i) {
            if(Collation::isSpecialCE32(jamoCE32s[i])) {
                isAnyJamoVTSpecial = TRUE;
                break;
            }
        }
        uint32_t hangulCE32 = Collation::makeCE32FromTagAndIndex(Collation::HANGUL_TAG, 0);
        UChar32 c = Hangul::HANGUL_BASE;
        for(int32_t i = 0; i < Hangul::JAMO_L_COUNT; ++i) {  // iterate over the Jamo L
            uint32_t ce32 = hangulCE32;
            if(!isAnyJamoVTSpecial && !Collation::isSpecialCE32(jamoCE32s[i])) {
                ce32 |= Collation::HANGUL_NO_SPECIAL_JAMO;
            }
            UChar32 limit = c + Hangul::JAMO_VT_COUNT;
            utrie2_setRange32(trie, c, limit - 1, ce32, TRUE, &errorCode);
            c = limit;
        }
    } else {
        // Copy the Hangul CE32s from the base in blocks per Jamo L,
        // assuming that HANGUL_NO_SPECIAL_JAMO is set or not set for whole blocks.
        for(UChar32 c = Hangul::HANGUL_BASE; c < Hangul::HANGUL_LIMIT;) {
            uint32_t ce32 = base->getCE32(c);
            U_ASSERT(Collation::hasCE32Tag(ce32, Collation::HANGUL_TAG));
            UChar32 limit = c + Hangul::JAMO_VT_COUNT;
            utrie2_setRange32(trie, c, limit - 1, ce32, TRUE, &errorCode);
            c = limit;
        }
    }

    setDigitTags(errorCode);
    setLeadSurrogates(errorCode);

    // For U+0000, move its normal ce32 into CE32s[0] and set U0000_TAG.
    ce32s.setElementAt((int32_t)utrie2_get32(trie, 0), 0);
    utrie2_set32(trie, 0, Collation::makeCE32FromTagAndIndex(Collation::U0000_TAG, 0), &errorCode);

    utrie2_freeze(trie, UTRIE2_32_VALUE_BITS, &errorCode);
    if(U_FAILURE(errorCode)) { return; }

    // Mark each lead surrogate as "unsafe"
    // if any of its 1024 associated supplementary code points is "unsafe".
    UChar32 c = 0x10000;
    for(UChar lead = 0xd800; lead < 0xdc00; ++lead, c += 0x400) {
        if(unsafeBackwardSet.containsSome(c, c + 0x3ff)) {
            unsafeBackwardSet.add(lead);
        }
    }
    unsafeBackwardSet.freeze();

    data.trie = trie;
    data.ce32s = reinterpret_cast<const uint32_t *>(ce32s.getBuffer());
    data.ces = ce64s.getBuffer();
    data.contexts = contexts.getBuffer();

    data.ce32sLength = ce32s.size();
    data.cesLength = ce64s.size();
    data.contextsLength = contexts.length();

    data.base = base;
    if(jamoIndex >= 0) {
        data.jamoCE32s = data.ce32s + jamoIndex;
    } else {
        data.jamoCE32s = base->jamoCE32s;
    }
    data.unsafeBackwardSet = &unsafeBackwardSet;
}